

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_io.c
# Opt level: O0

void voutlet_dspprolog(_voutlet *x,t_signal **parentsigs,int myvecsize,int calcsize,int phase,
                      int period,int frequency,int downsample,int upsample,int reblock,int switched)

{
  int iVar1;
  byte local_29;
  int period_local;
  int phase_local;
  int calcsize_local;
  int myvecsize_local;
  t_signal **parentsigs_local;
  _voutlet *x_local;
  
  if (x->x_buf != (t_sample *)0x0) {
    (x->x_updown).downsample = downsample;
    (x->x_updown).upsample = upsample;
    local_29 = 0;
    if (switched != 0) {
      local_29 = reblock != 0 ^ 0xff;
    }
    x->x_justcopyout = local_29 & 1;
    if (reblock == 0) {
      if (parentsigs == (t_signal **)0x0) {
        bug("voutlet_dspprolog");
      }
      iVar1 = outlet_getsignalindex(x->x_parentoutlet);
      x->x_directsignal = parentsigs[iVar1];
    }
    else {
      x->x_directsignal = (t_signal *)0x0;
    }
  }
  return;
}

Assistant:

void voutlet_dspprolog(struct _voutlet *x, t_signal **parentsigs,
    int myvecsize, int calcsize, int phase, int period, int frequency,
    int downsample, int upsample, int reblock, int switched)
{
        /* no buffer means we're not a signal outlet */
    if (!x->x_buf)
        return;
    x->x_updown.downsample=downsample;
    x->x_updown.upsample=upsample;
    x->x_justcopyout = (switched && !reblock);
    if (reblock)
    {
        x->x_directsignal = 0;
    }
    else
    {
        if (!parentsigs) bug("voutlet_dspprolog");
        x->x_directsignal =
            parentsigs[outlet_getsignalindex(x->x_parentoutlet)];
    }
}